

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_PushMatrix(void)

{
  uint uVar1;
  GPU_Target *pGVar2;
  float **ppfVar3;
  float *pfVar4;
  GPU_MatrixStack *local_38;
  uint local_2c;
  uint i;
  float **new_stack;
  uint new_storage_size;
  GPU_MatrixStack *stack;
  GPU_Target *target;
  
  pGVar2 = GPU_GetContextTarget();
  if ((pGVar2 != (GPU_Target *)0x0) && (pGVar2->context != (GPU_Context *)0x0)) {
    if (pGVar2->context->matrix_mode == 0) {
      local_38 = &pGVar2->context->modelview_matrix;
    }
    else {
      local_38 = &pGVar2->context->projection_matrix;
    }
    if (local_38->storage_size <= local_38->size + 1) {
      uVar1 = local_38->storage_size * 2 + 4;
      ppfVar3 = (float **)SDL_malloc((ulong)uVar1 << 3);
      for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
        pfVar4 = (float *)SDL_malloc(0x40);
        ppfVar3[local_2c] = pfVar4;
      }
      for (local_2c = 0; local_2c < local_38->size; local_2c = local_2c + 1) {
        GPU_MatrixCopy(ppfVar3[local_2c],local_38->matrix[local_2c]);
      }
      for (local_2c = 0; local_2c < local_38->storage_size; local_2c = local_2c + 1) {
        SDL_free(local_38->matrix[local_2c]);
      }
      SDL_free(local_38->matrix);
      local_38->storage_size = uVar1;
      local_38->matrix = ppfVar3;
    }
    GPU_MatrixCopy(local_38->matrix[local_38->size],local_38->matrix[local_38->size - 1]);
    local_38->size = local_38->size + 1;
  }
  return;
}

Assistant:

void GPU_PushMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return;
    
    stack = (target->context->matrix_mode == GPU_MODELVIEW? &target->context->modelview_matrix : &target->context->projection_matrix);
    if(stack->size + 1 >= stack->storage_size)
    {
        // Grow matrix stack (1, 6, 16, 36, ...)
        
        // Alloc new one
        unsigned int new_storage_size = stack->storage_size*2 + 4;
        float** new_stack = (float**)SDL_malloc(sizeof(float*) * new_storage_size);
        unsigned int i;
        for(i = 0; i < new_storage_size; ++i)
        {
            new_stack[i] = (float*)SDL_malloc(sizeof(float) * 16);
        }
        // Copy old one
        for(i = 0; i < stack->size; ++i)
        {
            GPU_MatrixCopy(new_stack[i], stack->matrix[i]);
        }
        // Free old one
        for(i = 0; i < stack->storage_size; ++i)
        {
            SDL_free(stack->matrix[i]);
        }
        SDL_free(stack->matrix);
        
        // Switch to new one
        stack->storage_size = new_storage_size;
        stack->matrix = new_stack;
    }
    GPU_MatrixCopy(stack->matrix[stack->size], stack->matrix[stack->size-1]);
    stack->size++;
}